

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O3

int mbedtls_md_hmac_finish(mbedtls_md_context_t *ctx,uchar *output)

{
  byte bVar1;
  void *pvVar2;
  int iVar3;
  uchar tmp [64];
  uchar auStack_68 [72];
  
  iVar3 = -0x5100;
  if (ctx != (mbedtls_md_context_t *)0x0) {
    if ((ctx->md_info != (mbedtls_md_info_t *)0x0) &&
       (pvVar2 = ctx->hmac_ctx, pvVar2 != (void *)0x0)) {
      bVar1 = ctx->md_info->block_size;
      iVar3 = mbedtls_md_finish(ctx,auStack_68);
      if ((iVar3 == 0) &&
         (((iVar3 = mbedtls_md_starts(ctx), iVar3 == 0 &&
           (iVar3 = mbedtls_md_update(ctx,(uchar *)((long)pvVar2 + (ulong)bVar1),
                                      (ulong)ctx->md_info->block_size), iVar3 == 0)) &&
          (iVar3 = mbedtls_md_update(ctx,auStack_68,(ulong)ctx->md_info->size), iVar3 == 0)))) {
        iVar3 = mbedtls_md_finish(ctx,output);
      }
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_md_hmac_finish( mbedtls_md_context_t *ctx, unsigned char *output )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char tmp[MBEDTLS_MD_MAX_SIZE];
    unsigned char *opad;

    if( ctx == NULL || ctx->md_info == NULL || ctx->hmac_ctx == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    opad = (unsigned char *) ctx->hmac_ctx + ctx->md_info->block_size;

    if( ( ret = mbedtls_md_finish( ctx, tmp ) ) != 0 )
        return( ret );
    if( ( ret = mbedtls_md_starts( ctx ) ) != 0 )
        return( ret );
    if( ( ret = mbedtls_md_update( ctx, opad,
                                   ctx->md_info->block_size ) ) != 0 )
        return( ret );
    if( ( ret = mbedtls_md_update( ctx, tmp,
                                   ctx->md_info->size ) ) != 0 )
        return( ret );
    return( mbedtls_md_finish( ctx, output ) );
}